

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_label_stmt(gvisitor_t *self,gnode_label_stmt_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  gVar1 = (node->base).token.type;
  if ((gVar1 != TOK_KEY_DEFAULT) && (gVar1 != TOK_KEY_CASE)) {
    __assert_fail("(type == TOK_KEY_DEFAULT) || (type == TOK_KEY_CASE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x18e,"void visit_label_stmt(gvisitor_t *, gnode_label_stmt_t *)");
  }
  ircode_marklabel((ircode_t *)plVar2[0x14],node->label_case,(node->base).token.lineno);
  gvisit(self,node->stmt);
  return;
}

Assistant:

static void visit_label_stmt (gvisitor_t *self, gnode_label_stmt_t *node) {
    DEBUG_CODEGEN("visit_label_stmt");
    DECLARE_CODE();

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_DEFAULT) || (type == TOK_KEY_CASE));

    ircode_marklabel(code, node->label_case, LINE_NUMBER(node));
    visit(node->stmt);
}